

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O2

int run_test_tcp_create_early_accept(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  undefined8 uStack_270;
  undefined1 auStack_268 [16];
  uv_tcp_t client;
  uv_tcp_t server;
  uv_connect_t connect_req;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&client);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(uVar2,&server);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_bind(&server,&client,0);
      if (iVar1 == 0) {
        iVar1 = uv_listen(&server,0x80,on_connection);
        if (iVar1 == 0) {
          uVar2 = uv_default_loop();
          iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_268);
          if (iVar1 == 0) {
            iVar1 = uv_tcp_init(uVar2,&client);
            if (iVar1 == 0) {
              iVar1 = uv_tcp_connect(&connect_req,&client,auStack_268,on_connect);
              if (iVar1 == 0) {
                uVar2 = uv_default_loop();
                uv_run(uVar2,0);
                loop = (uv_loop_t *)uv_default_loop();
                close_loop(loop);
                uVar2 = uv_default_loop();
                iVar1 = uv_loop_close(uVar2);
                if (iVar1 == 0) {
                  return 0;
                }
                pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                uStack_270 = 0xcf;
              }
              else {
                pcVar3 = "r == 0";
                uStack_270 = 0x5a;
              }
            }
            else {
              pcVar3 = "r == 0";
              uStack_270 = 0x54;
            }
          }
          else {
            pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &server_addr)";
            uStack_270 = 0x51;
          }
        }
        else {
          pcVar3 = "r == 0";
          uStack_270 = 0x49;
        }
      }
      else {
        pcVar3 = "r == 0";
        uStack_270 = 0x46;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_270 = 0x43;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)";
    uStack_270 = 0x40;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
          ,uStack_270,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_create_early_accept) {
  uv_tcp_t client, server;
  uv_connect_t connect_req;

  tcp_listener(uv_default_loop(), &server);
  tcp_connector(uv_default_loop(), &client, &connect_req);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}